

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

target_ulong helper_load_sr_ppc64(CPUPPCState_conflict2 *env,target_ulong sr_num)

{
  if ((env->mmu_model & 0x10000) == POWERPC_MMU_UNKNOWN) {
    return env->sr[sr_num];
  }
  return 0;
}

Assistant:

target_ulong helper_load_sr(CPUPPCState *env, target_ulong sr_num)
{
#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        /* XXX */
        return 0;
    }
#endif
    return env->sr[sr_num];
}